

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

void __thiscall
IRBuilder::BuildBrReg1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
          (IRBuilder *this,OpCode newOpcode,uint32 offset)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  uint functionId;
  undefined4 *puVar4;
  OpLayoutT_BrReg1<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *pOVar5;
  OpLayoutT_BrReg1<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *layout;
  uint32 offset_local;
  OpCode newOpcode_local;
  IRBuilder *this_local;
  
  bVar2 = OpCodeAttr::IsProfiledOp(newOpcode);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x1acb,"(!OpCodeAttr::IsProfiledOp(newOpcode))",
                       "!OpCodeAttr::IsProfiledOp(newOpcode)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = OpCodeAttr::HasMultiSizeLayout(newOpcode);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x1acc,"(OpCodeAttr::HasMultiSizeLayout(newOpcode))",
                       "OpCodeAttr::HasMultiSizeLayout(newOpcode)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pOVar5 = Js::ByteCodeReader::
           GetLayout<Js::OpLayoutT_BrReg1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>
                     (&this->m_jnReader);
  uVar3 = Func::GetSourceContextId(this->m_func);
  functionId = Func::GetLocalFunctionId(this->m_func);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,ClosureRegCheckPhase,uVar3,functionId);
  if (!bVar2) {
    DoClosureRegCheck(this,pOVar5->R1);
  }
  uVar3 = Js::ByteCodeReader::GetCurrentOffset(&this->m_jnReader);
  BuildBrReg1(this,newOpcode,offset,uVar3 + (int)pOVar5->RelativeJumpOffset,pOVar5->R1);
  return;
}

Assistant:

void
IRBuilder::BuildBrReg1(Js::OpCode newOpcode, uint32 offset)
{
    Assert(!OpCodeAttr::IsProfiledOp(newOpcode));
    Assert(OpCodeAttr::HasMultiSizeLayout(newOpcode));
    auto layout = m_jnReader.GetLayout<Js::OpLayoutT_BrReg1<SizePolicy>>();

    if (!PHASE_OFF(Js::ClosureRegCheckPhase, m_func))
    {
        this->DoClosureRegCheck(layout->R1);
    }

    BuildBrReg1(newOpcode, offset, m_jnReader.GetCurrentOffset() + layout->RelativeJumpOffset, layout->R1);
}